

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecompiler.cpp
# Opt level: O3

Error __thiscall
asmjit::CodeCompiler::_newConst(CodeCompiler *this,Mem *out,uint32_t scope,void *data,size_t size)

{
  uint32_t uVar1;
  uint32_t in_EAX;
  Error EVar2;
  CBConstPool *pCVar3;
  long lVar4;
  size_t off;
  uint32_t local_38 [2];
  
  if (scope == 0) {
    lVar4 = 0x1c8;
  }
  else {
    if (scope != 1) {
      EVar2 = 3;
      goto LAB_001637f9;
    }
    lVar4 = 0x1d0;
  }
  pCVar3 = *(CBConstPool **)
            ((long)&(this->super_CodeBuilder).super_CodeEmitter._vptr_CodeEmitter + lVar4);
  local_38[0] = in_EAX;
  if (pCVar3 == (CBConstPool *)0x0) {
    pCVar3 = CodeBuilder::newConstPool(&this->super_CodeBuilder);
    *(CBConstPool **)((long)&(this->super_CodeBuilder).super_CodeEmitter._vptr_CodeEmitter + lVar4)
         = pCVar3;
    if (pCVar3 == (CBConstPool *)0x0) {
      EVar2 = 1;
LAB_001637f9:
      EVar2 = CodeEmitter::setLastError((CodeEmitter *)this,EVar2,(char *)0x0);
      return EVar2;
    }
  }
  EVar2 = ConstPool::add(&pCVar3->_constPool,data,size,(size_t *)local_38);
  if (EVar2 == 0) {
    uVar1 = (pCVar3->super_CBLabel)._id;
    (out->super_Operand).super_Operand_.field_0._packed[0] =
         (UInt64)((ulong)(uint)((int)size << 0x18) | 0xffffffff0000000a);
    (out->super_Operand).super_Operand_.field_0._any.reserved8_4 = local_38[0];
    (out->super_Operand).super_Operand_.field_0._any.reserved12_4 = uVar1;
    EVar2 = 0;
  }
  else {
    EVar2 = CodeEmitter::setLastError((CodeEmitter *)this,EVar2,(char *)0x0);
  }
  return EVar2;
}

Assistant:

Error CodeCompiler::_newConst(Mem& out, uint32_t scope, const void* data, size_t size) {
  CBConstPool** pPool;
  if (scope == kConstScopeLocal)
    pPool = &_localConstPool;
  else if (scope == kConstScopeGlobal)
    pPool = &_globalConstPool;
  else
    return setLastError(DebugUtils::errored(kErrorInvalidArgument));

  if (!*pPool && !(*pPool = newConstPool()))
    return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

  CBConstPool* pool = *pPool;
  size_t off;

  Error err = pool->add(data, size, off);
  if (ASMJIT_UNLIKELY(err)) return setLastError(err);

  out = Mem(Init,
    Label::kLabelTag,             // Base type.
    pool->getId(),                // Base id.
    0,                            // Index type.
    kInvalidValue,                // Index id.
    static_cast<int32_t>(off),    // Offset.
    static_cast<uint32_t>(size),  // Size.
    0);                           // Flags.
  return kErrorOk;
}